

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O1

int8_t av1_ref_frame_type(MV_REFERENCE_FRAME *rf)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int8_t ref_idx;
  long lVar4;
  
  cVar2 = *rf;
  cVar1 = rf[1];
  if ('\0' < cVar1) {
    cVar3 = -1;
    if (cVar1 < '\x05' || '\x04' < cVar2) {
      lVar4 = 0;
      do {
        if ((cVar2 == (&comp_ref0_lut)[lVar4]) && (cVar1 == (&comp_ref1_lut)[lVar4])) {
          cVar3 = (char)lVar4;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 9);
    }
    if (-1 < cVar3) {
      return cVar3 + '\x14';
    }
    cVar2 = cVar1 * '\x04' + *rf + -0xd;
  }
  return cVar2;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}